

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int xmlAddEncodingAlias(char *name,char *alias)

{
  __int32_t _Var1;
  __int32_t *p_Var2;
  xmlCharEncodingAliasPtr pxVar3;
  int iVar4;
  __int32_t **pp_Var5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  char upper [100];
  char local_98 [104];
  
  iVar4 = -1;
  if (alias != (char *)0x0 && name != (char *)0x0) {
    pp_Var5 = __ctype_toupper_loc();
    p_Var2 = *pp_Var5;
    uVar6 = 0;
    do {
      _Var1 = p_Var2[alias[uVar6]];
      local_98[uVar6] = (char)_Var1;
      if ((char)_Var1 == '\0') goto LAB_00142e33;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 99);
    uVar6 = 99;
LAB_00142e33:
    local_98[uVar6 & 0xffffffff] = '\0';
    if (xmlCharEncodingAliases == (xmlCharEncodingAliasPtr)0x0) {
      xmlCharEncodingAliasesNb = 0;
      xmlCharEncodingAliasesMax = 0x14;
      xmlCharEncodingAliases = (xmlCharEncodingAliasPtr)(*xmlMalloc)(0x140);
      if (xmlCharEncodingAliases == (xmlCharEncodingAliasPtr)0x0) {
        return -1;
      }
    }
    else {
      lVar8 = (long)xmlCharEncodingAliasesMax;
      if (xmlCharEncodingAliasesMax <= xmlCharEncodingAliasesNb) {
        xmlCharEncodingAliasesMax = xmlCharEncodingAliasesMax * 2;
        xmlCharEncodingAliases =
             (xmlCharEncodingAliasPtr)(*xmlRealloc)(xmlCharEncodingAliases,lVar8 << 5);
      }
    }
    pxVar3 = xmlCharEncodingAliases;
    if (0 < xmlCharEncodingAliasesNb) {
      uVar6 = (ulong)(uint)xmlCharEncodingAliasesNb;
      lVar8 = 0;
      do {
        iVar4 = strcmp(*(char **)((long)&pxVar3->alias + lVar8),local_98);
        if (iVar4 == 0) {
          (*xmlFree)(*(void **)((long)&pxVar3->name + lVar8));
          pcVar7 = (*xmlMemStrdup)(name);
          *(char **)((long)&xmlCharEncodingAliases->name + lVar8) = pcVar7;
          goto LAB_00142f50;
        }
        lVar8 = lVar8 + 0x10;
      } while (uVar6 << 4 != lVar8);
    }
    pcVar7 = (*xmlMemStrdup)(name);
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].name = pcVar7;
    pcVar7 = (*xmlMemStrdup)(local_98);
    lVar8 = (long)xmlCharEncodingAliasesNb;
    xmlCharEncodingAliasesNb = xmlCharEncodingAliasesNb + 1;
    xmlCharEncodingAliases[lVar8].alias = pcVar7;
LAB_00142f50:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
xmlAddEncodingAlias(const char *name, const char *alias) {
    int i;
    char upper[100];

    if ((name == NULL) || (alias == NULL))
	return(-1);

    for (i = 0;i < 99;i++) {
        upper[i] = toupper(alias[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (xmlCharEncodingAliases == NULL) {
	xmlCharEncodingAliasesNb = 0;
	xmlCharEncodingAliasesMax = 20;
	xmlCharEncodingAliases = (xmlCharEncodingAliasPtr)
	      xmlMalloc(xmlCharEncodingAliasesMax * sizeof(xmlCharEncodingAlias));
	if (xmlCharEncodingAliases == NULL)
	    return(-1);
    } else if (xmlCharEncodingAliasesNb >= xmlCharEncodingAliasesMax) {
	xmlCharEncodingAliasesMax *= 2;
	xmlCharEncodingAliases = (xmlCharEncodingAliasPtr)
	      xmlRealloc(xmlCharEncodingAliases,
		         xmlCharEncodingAliasesMax * sizeof(xmlCharEncodingAlias));
    }
    /*
     * Walk down the list looking for a definition of the alias
     */
    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (!strcmp(xmlCharEncodingAliases[i].alias, upper)) {
	    /*
	     * Replace the definition.
	     */
	    xmlFree((char *) xmlCharEncodingAliases[i].name);
	    xmlCharEncodingAliases[i].name = xmlMemStrdup(name);
	    return(0);
	}
    }
    /*
     * Add the definition
     */
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].name = xmlMemStrdup(name);
    xmlCharEncodingAliases[xmlCharEncodingAliasesNb].alias = xmlMemStrdup(upper);
    xmlCharEncodingAliasesNb++;
    return(0);
}